

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O1

parser<pstore::exchange::import_ns::callbacks> * __thiscall
(anonymous_namespace)::
make_json_object_parser<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          _anonymous_namespace_ *this,database *db,section_kind args,string_mapping *args_1,
          section_content *args_2,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *args_3)

{
  undefined7 in_register_00000009;
  callbacks local_50;
  callbacks local_40;
  not_null<pstore::database_*> local_30;
  
  local_30.ptr_ = (database *)this;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_30);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            (&local_40,local_30,text,(string_mapping *)db,
             (section_content *)CONCAT71(in_register_00000009,args),
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)args_1);
  local_50.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_40.context_.
          super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_40.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            (__return_storage_ptr__,&local_50,none);
  if (local_50.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

decltype (auto) make_json_object_parser (pstore::database * const db, Args... args) {
        using namespace pstore::exchange::import_ns;
        return pstore::json::make_parser (
            callbacks::make<object_rule<ImportRule, Args...>> (db, args...));
    }